

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.cpp
# Opt level: O2

void __thiscall
pele::physics::PMF::PmfData::read_pmf(PmfData *this,string *fname,int a_doAverage,int param_3)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  istream *piVar5;
  Arena *pAVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint j;
  size_type __new_size;
  size_type sVar11;
  bool bVar12;
  string firstline;
  string remaininglines;
  string secondline;
  string memfile;
  istringstream sinput;
  ostream local_530 [376];
  istringstream iss;
  ifstream infile;
  streambuf local_228 [504];
  
  firstline._M_dataplus._M_p = (pointer)&firstline.field_2;
  firstline._M_string_length = 0;
  secondline._M_dataplus._M_p = (pointer)&secondline.field_2;
  secondline._M_string_length = 0;
  firstline.field_2._M_local_buf[0] = '\0';
  secondline.field_2._M_local_buf[0] = '\0';
  remaininglines._M_dataplus._M_p = (pointer)&remaininglines.field_2;
  remaininglines._M_string_length = 0;
  remaininglines.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile,(string *)fname,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sinput,
                   "Unable to open pmf input file ",fname);
    amrex::Abort((string *)&sinput);
    std::__cxx11::string::~string((string *)&sinput);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sinput);
  std::ostream::operator<<(local_530,local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&sinput);
  std::ifstream::close();
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&memfile,_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&iss,(string *)&firstline);
  bVar12 = false;
  for (sVar7 = 0; firstline._M_string_length != sVar7; sVar7 = sVar7 + 1) {
    bVar12 = (bool)(bVar12 ^ firstline._M_dataplus._M_p[sVar7] == '\"');
  }
  if (bVar12) {
    amrex::Abort_host("PMF file variable quotes unbalanced");
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&iss,(string *)&secondline);
  __new_size = 0;
  uVar8 = 0;
  uVar3 = 0;
  while ((uVar8 < firstline._M_string_length - 1 && (uVar3 < firstline._M_string_length - 1))) {
    std::__cxx11::string::find((char)&firstline,0x22);
    uVar3 = std::__cxx11::string::find((char)&firstline,0x22);
    uVar8 = uVar3 + 1;
    __new_size = __new_size + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,__new_size);
  lVar10 = 0;
  sVar11 = __new_size;
  while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
    std::__cxx11::string::find((char)&firstline,0x22);
    std::__cxx11::string::find((char)&firstline,0x22);
    std::__cxx11::string::substr((ulong)&sinput,(ulong)&firstline);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((this->pmf_names).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10),
               (string *)&sinput);
    std::__cxx11::string::~string((string *)&sinput);
    lVar10 = lVar10 + 0x20;
  }
  poVar4 = amrex::OutStream();
  amrex::Print::Print((Print *)&sinput,poVar4);
  std::ostream::operator<<(local_530,(int)__new_size);
  std::operator<<(local_530," variables found in PMF file");
  std::endl<char,std::char_traits<char>>(local_530);
  amrex::Print::~Print((Print *)&sinput);
  uVar9 = 0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,(string *)&remaininglines);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    uVar9 = uVar9 + 1;
  }
  poVar4 = amrex::OutStream();
  amrex::Print::Print((Print *)&sinput,poVar4);
  std::ostream::operator<<(local_530,uVar9);
  std::operator<<(local_530," data lines found in PMF file");
  std::endl<char,std::char_traits<char>>(local_530);
  amrex::Print::~Print((Print *)&sinput);
  (this->m_data_h).m_nPoint = uVar9;
  (this->m_data_h).m_nVar = (int)__new_size - 1;
  (this->m_data_h).m_doAverage = a_doAverage;
  pAVar6 = amrex::The_Pinned_Arena();
  iVar2 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)uVar9 << 3);
  (this->m_data_h).pmf_X = (Real *)CONCAT44(extraout_var,iVar2);
  pAVar6 = amrex::The_Pinned_Arena();
  iVar2 = (*pAVar6->_vptr_Arena[2])(pAVar6);
  (this->m_data_h).pmf_Y = (Real *)CONCAT44(extraout_var_00,iVar2);
  this->m_host_allocated = true;
  std::ios::clear((int)(istream *)&iss + (int)*(undefined8 *)(_iss + -0x18));
  std::istream::seekg((long)&iss,_S_beg);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&iss,(string *)&firstline);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&iss,(string *)&secondline);
  for (uVar3 = 0; uVar3 < (this->m_data_h).m_nPoint; uVar3 = uVar3 + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&iss,(string *)&remaininglines);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&sinput,(string *)&remaininglines,_S_in);
    std::istream::_M_extract<double>((double *)&sinput);
    for (uVar9 = 0; uVar9 < (this->m_data_h).m_nVar; uVar9 = uVar9 + 1) {
      std::istream::_M_extract<double>((double *)&sinput);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&sinput);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&memfile);
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&remaininglines);
  std::__cxx11::string::~string((string *)&secondline);
  std::__cxx11::string::~string((string *)&firstline);
  return;
}

Assistant:

void
PmfData::read_pmf(const std::string& fname, int a_doAverage, int /*a_verbose*/)
{
  std::string firstline, secondline, remaininglines;
  unsigned long pos1, pos2;
  int variable_count, line_count;

  std::ifstream infile(fname);
  if (!infile.is_open()) {
    amrex::Abort("Unable to open pmf input file " + fname);
  }
  const std::string memfile = read_pmf_file(infile);
  infile.close();
  std::istringstream iss(memfile);

  std::getline(iss, firstline);
  if (!checkQuotes(firstline)) {
    amrex::Abort("PMF file variable quotes unbalanced");
  }
  std::getline(iss, secondline);
  pos1 = 0;
  pos2 = 0;
  variable_count = 0;
  while ((pos1 < firstline.length() - 1) && (pos2 < firstline.length() - 1)) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    variable_count++;
    pos1 = pos2 + 1;
  }

  pmf_names.resize(variable_count);
  pos1 = 0;
  pos2 = 0;
  for (int i = 0; i < variable_count; i++) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    pmf_names[i] = firstline.substr(pos1 + 1, pos2 - (pos1 + 1));
    pos1 = pos2 + 1;
  }

  // Check variable names

  amrex::Print() << variable_count << " variables found in PMF file"
                 << std::endl;
  // for (int i = 0; i < variable_count; i++)
  //  amrex::Print() << "Variable found: " << PMF::pmf_names[i] <<
  //  std::endl;

  line_count = 0;
  while (std::getline(iss, remaininglines)) {
    line_count++;
  }
  amrex::Print() << line_count << " data lines found in PMF file" << std::endl;

  m_data_h.m_nPoint = line_count;
  m_data_h.m_nVar = variable_count - 1;
  m_data_h.m_doAverage = a_doAverage;
  m_data_h.pmf_X = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * sizeof(amrex::Real));
  m_data_h.pmf_Y = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * (variable_count - 1) * sizeof(amrex::Real));
  m_host_allocated = true;

  iss.clear();
  iss.seekg(0, std::ios::beg);
  std::getline(iss, firstline);
  std::getline(iss, secondline);
  for (unsigned int i = 0; i < m_data_h.m_nPoint; i++) {
    std::getline(iss, remaininglines);
    std::istringstream sinput(remaininglines);
    sinput >> m_data_h.pmf_X[i];
    for (unsigned int j = 0; j < m_data_h.m_nVar; j++) {
      sinput >> m_data_h.pmf_Y[j * m_data_h.m_nPoint + i];
    }
  }
}